

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O0

void __thiscall Lesson::print(Lesson *this)

{
  ostream *poVar1;
  size_type sVar2;
  reference this_00;
  ulong local_18;
  size_t i;
  Lesson *this_local;
  
  if ((this->exist & 1U) == 0) {
    std::operator<<((ostream *)&std::cout,"none ");
    poVar1 = std::operator<<((ostream *)&std::cout,"exist: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(this->exist & 1));
    std::operator<<(poVar1," ");
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"subject: ");
    poVar1 = std::operator<<(poVar1,(string *)&this->subject);
    std::operator<<(poVar1," ");
    poVar1 = std::operator<<((ostream *)&std::cout,"room: ");
    poVar1 = std::operator<<(poVar1,(string *)&this->room);
    std::operator<<(poVar1," ");
    local_18 = 0;
    while( true ) {
      sVar2 = std::vector<Professor,_std::allocator<Professor>_>::size(&this->prep_list);
      if (sVar2 <= local_18) break;
      this_00 = std::vector<Professor,_std::allocator<Professor>_>::operator[]
                          (&this->prep_list,local_18);
      Professor::print(this_00,false);
      local_18 = local_18 + 1;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"time: ");
    poVar1 = std::operator<<(poVar1,(string *)&this->time);
    std::operator<<(poVar1," ");
    poVar1 = std::operator<<((ostream *)&std::cout,"exist: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(this->exist & 1));
    std::operator<<(poVar1," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Lesson::print() {
    //std::cout  << "id: " << lesson_id << " ";
    if (exist) {
        std::cout  <<  "subject: "  << subject << " ";
        std::cout  << "room: " << room << " ";
        //std::cout  << "preps: " << professor << " ";

        for(size_t i = 0; i < prep_list.size(); i++) {

            prep_list[i].print();
        }
        std::cout << "time: " << time << " ";
        std::cout << "exist: " << exist << " ";
    }
    else {
        std::cout << "none " ;
        std::cout << "exist: " << exist << " ";
    }
    std::cout<<std::endl;



}